

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit> *assumps)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Var VVar5;
  Lit *pLVar6;
  uchar *tbs;
  size_t *siglen;
  FILE *in_RSI;
  uchar *sig;
  long in_RDI;
  size_t in_R8;
  int i_3;
  int i_2;
  int j;
  Clause *c;
  int i_1;
  int i;
  int cnt;
  Var max;
  vec<int> map;
  undefined4 in_stack_fffffffffffffe88;
  Ref in_stack_fffffffffffffe8c;
  ClauseAllocator *in_stack_fffffffffffffe90;
  Solver *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  Clause *in_stack_fffffffffffffec0;
  Solver *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  FILE *in_stack_fffffffffffffed8;
  Solver *in_stack_fffffffffffffee0;
  int local_74;
  uint local_68;
  lbool local_5d;
  int local_5c;
  uint8_t local_55;
  int local_54;
  Clause *local_50;
  int local_48;
  int local_34;
  uint local_30;
  uint local_2c;
  vec<int> local_28;
  FILE *local_10;
  
  if ((*(byte *)(in_RDI + 0x228) & 1) == 0) {
    fprintf(in_RSI,"p cnf 1 2\n1 0\n-1 0\n");
  }
  else {
    local_10 = in_RSI;
    vec<int>::vec(&local_28);
    local_2c = 0;
    local_30 = 0;
    for (local_34 = 0; iVar3 = local_34,
        iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x230)), iVar3 < iVar2;
        local_34 = local_34 + 1) {
      vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_34);
      ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      bVar1 = satisfied(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      if (!bVar1) {
        local_30 = local_30 + 1;
      }
    }
    for (local_48 = 0; iVar3 = local_48,
        iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x230)), iVar3 < iVar2;
        local_48 = local_48 + 1) {
      vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_48);
      ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      bVar1 = satisfied(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      if (!bVar1) {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_48);
        local_50 = ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        for (local_54 = 0; iVar3 = local_54, iVar2 = Clause::size(local_50), iVar3 < iVar2;
            local_54 = local_54 + 1) {
          pLVar6 = Clause::operator[](local_50,local_54);
          local_5c = pLVar6->x;
          local_55 = (uint8_t)value(in_stack_fffffffffffffe98,(Lit)(int)in_stack_fffffffffffffea0);
          lbool::lbool(&local_5d,'\x01');
          bVar1 = lbool::operator!=((lbool *)CONCAT44(in_stack_fffffffffffffe8c,
                                                      in_stack_fffffffffffffe88),
                                    (lbool)(uint8_t)((ulong)in_stack_fffffffffffffe90 >> 0x38));
          if (bVar1) {
            pLVar6 = Clause::operator[](local_50,local_54);
            var((Lit)pLVar6->x);
            mapVar((Var)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   (vec<int> *)in_stack_fffffffffffffe98,(Var *)in_stack_fffffffffffffe90);
          }
        }
      }
    }
    iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x3c0));
    local_30 = iVar3 + local_30;
    fprintf(local_10,"p cnf %d %d\n",(ulong)local_2c,(ulong)local_30);
    local_68 = 0;
    while( true ) {
      uVar4 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x3c0));
      tbs = (uchar *)(ulong)uVar4;
      if ((int)uVar4 <= (int)local_68) break;
      sig = (uchar *)(ulong)local_68;
      in_stack_fffffffffffffed8 = local_10;
      in_stack_fffffffffffffee0 =
           (Solver *)vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x3c0),local_68);
      uVar4 = sign((EVP_PKEY_CTX *)(ulong)*(uint *)&in_stack_fffffffffffffee0->_vptr_Solver,sig,
                   siglen,tbs,in_R8);
      in_stack_fffffffffffffed7 = (undefined1)uVar4;
      in_stack_fffffffffffffec0 = (Clause *)0x16c565;
      if ((uVar4 & 1) != 0) {
        in_stack_fffffffffffffec0 = (Clause *)0x16c505;
      }
      in_stack_fffffffffffffec8 =
           (Solver *)vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x3c0),local_68);
      var((Lit)*(int *)&in_stack_fffffffffffffec8->_vptr_Solver);
      VVar5 = mapVar((Var)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     (vec<int> *)in_stack_fffffffffffffe98,(Var *)in_stack_fffffffffffffe90);
      fprintf(in_stack_fffffffffffffed8,"%s%d 0\n",in_stack_fffffffffffffec0,(ulong)(VVar5 + 1));
      local_68 = local_68 + 1;
    }
    for (local_74 = 0; iVar3 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x230)),
        local_74 < iVar3; local_74 = local_74 + 1) {
      vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x230),local_74);
      in_stack_fffffffffffffe90 =
           (ClauseAllocator *)
           ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      toDimacs(in_stack_fffffffffffffee0,(FILE *)in_stack_fffffffffffffed8,
               (Clause *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (vec<int> *)in_stack_fffffffffffffec8,(Var *)in_stack_fffffffffffffec0);
    }
    if (0 < *(int *)(in_RDI + 0x34)) {
      printf("c Wrote DIMACS with %d variables and %d clauses.\n",(ulong)local_2c,(ulong)local_30);
    }
    vec<int>::~vec((vec<int> *)0x13eb8e);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, const vec<Lit> &assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok) {
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return;
    }

    vec<Var> map;
    Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])) cnt++;

    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])) {
            Clause &c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False) mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumptions.size(); i++) {
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max) + 1);
    }

    for (int i = 0; i < clauses.size(); i++) toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0) printf("c Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}